

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

void ZSTD_reduceIndex(ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,U32 reducerValue)

{
  int iVar1;
  U32 size;
  U32 h3Size;
  U32 chainSize;
  U32 hSize;
  U32 reducerValue_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_matchState_t *ms_local;
  
  ZSTD_reduceTable(ms->hashTable,1 << ((byte)(params->cParams).hashLog & 0x1f),reducerValue);
  iVar1 = ZSTD_allocateChainTable
                    ((params->cParams).strategy,params->useRowMatchFinder,ms->dedicatedDictSearch);
  if (iVar1 != 0) {
    size = 1 << ((byte)(params->cParams).chainLog & 0x1f);
    if ((params->cParams).strategy == ZSTD_btlazy2) {
      ZSTD_reduceTable_btlazy2(ms->chainTable,size,reducerValue);
    }
    else {
      ZSTD_reduceTable(ms->chainTable,size,reducerValue);
    }
  }
  if (ms->hashLog3 != 0) {
    ZSTD_reduceTable(ms->hashTable3,1 << ((byte)ms->hashLog3 & 0x1f),reducerValue);
  }
  return;
}

Assistant:

static void ZSTD_reduceIndex (ZSTD_matchState_t* ms, ZSTD_CCtx_params const* params, const U32 reducerValue)
{
    {   U32 const hSize = (U32)1 << params->cParams.hashLog;
        ZSTD_reduceTable(ms->hashTable, hSize, reducerValue);
    }

    if (ZSTD_allocateChainTable(params->cParams.strategy, params->useRowMatchFinder, (U32)ms->dedicatedDictSearch)) {
        U32 const chainSize = (U32)1 << params->cParams.chainLog;
        if (params->cParams.strategy == ZSTD_btlazy2)
            ZSTD_reduceTable_btlazy2(ms->chainTable, chainSize, reducerValue);
        else
            ZSTD_reduceTable(ms->chainTable, chainSize, reducerValue);
    }

    if (ms->hashLog3) {
        U32 const h3Size = (U32)1 << ms->hashLog3;
        ZSTD_reduceTable(ms->hashTable3, h3Size, reducerValue);
    }
}